

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O1

void single_channel_8_to_abgr_f32
               (void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy,
               int width,int height)

{
  ALLEGRO_COLOR *pAVar1;
  int iVar2;
  ALLEGRO_COLOR *pAVar3;
  uchar *puVar4;
  int iVar5;
  ALLEGRO_COLOR AVar6;
  
  if (0 < height) {
    pAVar3 = (ALLEGRO_COLOR *)((long)dst + (long)(dy * dst_pitch) + (long)dx * 0x10);
    puVar4 = (uchar *)((long)src + (long)(sy * src_pitch) + (long)sx);
    iVar2 = dst_pitch + 0xf;
    if (-1 < dst_pitch) {
      iVar2 = dst_pitch;
    }
    iVar5 = 0;
    do {
      if (0 < width) {
        pAVar1 = pAVar3 + width;
        do {
          AVar6 = al_map_rgb(*puVar4,'\0','\0');
          *pAVar3 = AVar6;
          pAVar3 = pAVar3 + 1;
          puVar4 = puVar4 + 1;
        } while (pAVar3 < pAVar1);
      }
      pAVar3 = pAVar3 + ((iVar2 >> 4) - width);
      puVar4 = puVar4 + (src_pitch - width);
      iVar5 = iVar5 + 1;
    } while (iVar5 != height);
  }
  return;
}

Assistant:

static void single_channel_8_to_abgr_f32(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const uint8_t *src_ptr = (const uint8_t *)((const char *)src + sy * src_pitch);
   ALLEGRO_COLOR *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 1 - width;
   int dst_gap = dst_pitch / 16 - width;
   src_ptr += sx;
   dst_ptr += dx;
   for (y = 0; y < height; y++) {
      ALLEGRO_COLOR *dst_end = dst_ptr + width;
      while (dst_ptr < dst_end) {
         *dst_ptr = ALLEGRO_CONVERT_SINGLE_CHANNEL_8_TO_ABGR_F32(*src_ptr);
         dst_ptr++;
         src_ptr++;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}